

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

void __thiscall helics::Federate::enterExecutingModeAsync(Federate *this,IterationRequest iterate)

{
  string_view message;
  string_view message_00;
  Modes MVar1;
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  undefined8 uVar2;
  future<helics::iteration_time> *__fut;
  undefined1 in_SIL;
  size_t in_RDI;
  handle asyncInfo_1;
  type eExecFunc_1;
  handle asyncInfo;
  type eExecFunc;
  shared_guarded<helics::AsyncFedCallInfo,_std::mutex> *in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff38;
  Federate *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff50;
  Federate *in_stack_ffffffffffffff80;
  type *in_stack_ffffffffffffffa0;
  launch in_stack_ffffffffffffffac;
  lock_handle<helics::AsyncFedCallInfo,_std::mutex> local_48;
  undefined1 local_28;
  undefined1 local_9;
  
  if ((*(byte *)(in_RDI + 0xe) & 1) != 0) {
    this_00 = (basic_string_view<char,_std::char_traits<char>_> *)__cxa_allocate_exception(0x28);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (this_00,in_stack_ffffffffffffff38);
    message._M_str = in_stack_ffffffffffffff50;
    message._M_len = in_RDI;
    InvalidFunctionCall::InvalidFunctionCall((InvalidFunctionCall *)this_00,message);
    __cxa_throw(this_00,&InvalidFunctionCall::typeinfo,InvalidFunctionCall::~InvalidFunctionCall);
  }
  local_9 = in_SIL;
  MVar1 = std::atomic::operator_cast_to_Modes((atomic<helics::Federate::Modes> *)0x2557af);
  __fut = (future<helics::iteration_time> *)(ulong)MVar1;
  switch(__fut) {
  case (future<helics::iteration_time> *)0x0:
    local_28 = local_9;
    std::
    unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
    ::operator->((unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
                  *)0x2557f8);
    gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>::lock
              (in_stack_ffffffffffffff28);
    updateFederateMode(in_stack_ffffffffffffff40,(Modes)((ulong)__fut >> 0x38));
    std::async<helics::Federate::enterExecutingModeAsync(helics::IterationRequest)::__0&>
              (in_stack_ffffffffffffffac,(type *)in_stack_ffffffffffffffa0);
    gmlc::libguarded::lock_handle<helics::AsyncFedCallInfo,_std::mutex>::operator->(&local_48);
    std::future<helics::iteration_time>::operator=
              ((future<helics::iteration_time> *)in_stack_ffffffffffffff40,__fut);
    std::future<helics::iteration_time>::~future((future<helics::iteration_time> *)0x25585a);
    gmlc::libguarded::lock_handle<helics::AsyncFedCallInfo,_std::mutex>::~lock_handle
              ((lock_handle<helics::AsyncFedCallInfo,_std::mutex> *)0x255867);
    break;
  case (future<helics::iteration_time> *)0x2:
  case (future<helics::iteration_time> *)0x6:
  case (future<helics::iteration_time> *)0x7:
  case (future<helics::iteration_time> *)0x8:
    break;
  default:
    uVar2 = __cxa_allocate_exception(0x28);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff40,
               (char *)__fut);
    message_00._M_str = in_stack_ffffffffffffff50;
    message_00._M_len = in_RDI;
    InvalidFunctionCall::InvalidFunctionCall
              ((InvalidFunctionCall *)in_stack_ffffffffffffff40,message_00);
    __cxa_throw(uVar2,&InvalidFunctionCall::typeinfo,InvalidFunctionCall::~InvalidFunctionCall);
  case (future<helics::iteration_time> *)0x5:
    enterInitializingModeComplete(in_stack_ffffffffffffff80);
  case (future<helics::iteration_time> *)0x1:
    std::
    unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
    ::operator->((unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
                  *)0x2558ba);
    gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>::lock
              (in_stack_ffffffffffffff28);
    updateFederateMode(in_stack_ffffffffffffff40,(Modes)((ulong)__fut >> 0x38));
    std::async<helics::Federate::enterExecutingModeAsync(helics::IterationRequest)::__1&>
              (in_stack_ffffffffffffffac,in_stack_ffffffffffffffa0);
    gmlc::libguarded::lock_handle<helics::AsyncFedCallInfo,_std::mutex>::operator->
              ((lock_handle<helics::AsyncFedCallInfo,_std::mutex> *)&stack0xffffffffffffff70);
    std::future<helics::iteration_time>::operator=
              ((future<helics::iteration_time> *)in_stack_ffffffffffffff40,__fut);
    std::future<helics::iteration_time>::~future((future<helics::iteration_time> *)0x255913);
    gmlc::libguarded::lock_handle<helics::AsyncFedCallInfo,_std::mutex>::~lock_handle
              ((lock_handle<helics::AsyncFedCallInfo,_std::mutex> *)0x25591d);
  }
  return;
}

Assistant:

void Federate::enterExecutingModeAsync(IterationRequest iterate)
{
    if (singleThreadFederate) {
        throw(InvalidFunctionCall(
            "Async function calls and methods are not allowed for single thread federates"));
    }
    switch (currentMode) {
        case Modes::STARTUP: {
            auto eExecFunc = [this, iterate]() {
                if (hasPotentialInterfaces) {
                    potentialInterfacesStartupSequence();
                }
                coreObject->enterInitializingMode(fedID);
                mCurrentTime = coreObject->getCurrentTime(fedID);
                startupToInitializeStateTransition();
                return coreObject->enterExecutingMode(fedID, iterate);
            };
            auto asyncInfo = asyncCallInfo->lock();
            updateFederateMode(Modes::PENDING_EXEC);
            asyncInfo->execFuture = std::async(std::launch::async, eExecFunc);
        } break;
        case Modes::PENDING_INIT:
            enterInitializingModeComplete();
            [[fallthrough]];
        case Modes::INITIALIZING: {
            auto eExecFunc = [this, iterate]() {
                return coreObject->enterExecutingMode(fedID, iterate);
            };
            auto asyncInfo = asyncCallInfo->lock();
            updateFederateMode(Modes::PENDING_EXEC);
            asyncInfo->execFuture = std::async(std::launch::async, eExecFunc);
        } break;
        case Modes::PENDING_EXEC:
        case Modes::EXECUTING:
        case Modes::PENDING_TIME:
        case Modes::PENDING_ITERATIVE_TIME:
            // we are already in or executing a function that would achieve this request
            break;
        default:
            throw(InvalidFunctionCall("cannot transition from current state to execution state"));
            break;
    }
}